

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::cast_from_variable_load
          (CompilerGLSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  uint uVar1;
  BaseType BVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRVariable *pSVar5;
  BaseType BVar6;
  string local_48;
  
  if ((expr_type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    return;
  }
  pSVar5 = Compiler::maybe_get_backing_variable(&this->super_Compiler,source_id);
  if (pSVar5 != (SPIRVariable *)0x0) {
    source_id = (pSVar5->super_IVariant).self.id;
  }
  bVar3 = Compiler::has_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  if (!bVar3) {
    return;
  }
  uVar4 = Compiler::get_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  BVar2 = *(BaseType *)&(expr_type->super_IVariant).field_0xc;
  BVar6 = BVar2;
  if ((int)uVar4 < 0x1148) {
    if (0x2b < uVar4) goto LAB_002174b3;
    if ((0xc00001406e0U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      if ((0x3f000000UL >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_002174b3;
LAB_0021748c:
      BVar6 = UInt;
      goto LAB_002174b3;
    }
  }
  else {
    uVar1 = uVar4 - 0x14ae;
    if (uVar1 < 0x3a) {
      if ((0x200000006000007U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_0021748c;
      if ((ulong)uVar1 == 0x21) goto LAB_002174ae;
    }
    if (((0x14 < uVar4 - 0x1148) || ((0x100107U >> (uVar4 - 0x1148 & 0x1f) & 1) == 0)) &&
       (uVar4 != 0x1396)) goto LAB_002174b3;
  }
LAB_002174ae:
  BVar6 = Int;
LAB_002174b3:
  if (BVar6 != BVar2) {
    bitcast_expression(&local_48,this,expr_type,BVar6,expr);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

bool empty() const SPIRV_CROSS_NOEXCEPT
	{
		return buffer_size == 0;
	}